

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O1

void dwt(wt_object wt,double *inp)

{
  wt_object pwVar1;
  int iVar2;
  wave_object pwVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  wt_object sig;
  double *cA;
  wt_object pwVar9;
  long lVar10;
  int iVar11;
  double dVar12;
  ulong local_38;
  ulong uVar8;
  
  local_38 = (ulong)wt->siglength;
  iVar2 = wt->J;
  lVar7 = (long)iVar2;
  wt->length[lVar7 + 1] = wt->siglength;
  wt->outlength = 0;
  wt->zpad = 0;
  sig = (wt_object)malloc(local_38 << 3);
  cA = (double *)malloc(local_38 << 3);
  if (0 < (long)wt->siglength) {
    memcpy(sig,inp,(long)wt->siglength << 3);
  }
  iVar11 = wt->wave->lpd_len;
  iVar5 = strcmp(wt->ext,"per");
  if (iVar5 == 0) {
    if (0 < iVar2) {
      iVar11 = wt->outlength;
      uVar8 = local_38;
      lVar10 = lVar7;
      do {
        dVar12 = ceil((double)(int)uVar8 * 0.5);
        uVar6 = (uint)dVar12;
        uVar8 = (ulong)uVar6;
        wt->length[lVar10] = uVar6;
        iVar11 = iVar11 + uVar6;
        bVar4 = 1 < lVar10;
        lVar10 = lVar10 + -1;
      } while (bVar4);
      wt->outlength = iVar11;
    }
    iVar11 = wt->length[1];
    wt->length[0] = iVar11;
    iVar11 = iVar11 + wt->outlength;
    wt->outlength = iVar11;
    if (0 < iVar2) {
      pwVar1 = wt + 1;
      lVar10 = 0;
      do {
        uVar6 = wt->length[lVar7 + lVar10];
        iVar11 = iVar11 - uVar6;
        iVar5 = strcmp(wt->cmethod,"fft");
        if ((iVar5 == 0) || (iVar5 = strcmp(wt->cmethod,"FFT"), iVar5 == 0)) {
          dwt1(wt,(double *)sig,(int)local_38,cA,
               (double *)(pwVar1->method + (long)iVar11 * 8 + -0x10));
        }
        else {
          pwVar3 = wt->wave;
          dwt_per_stride((double *)sig,(int)local_38,pwVar3->lpd,pwVar3->hpd,pwVar3->lpd_len,cA,
                         uVar6,(double *)(pwVar1->method + (long)iVar11 * 8 + -0x10),1,1);
        }
        local_38 = (ulong)(uint)wt->length[lVar7 + lVar10];
        if (0 < (int)uVar6) {
          pwVar9 = sig;
          if (-(ulong)(iVar2 - 1) == lVar10) {
            pwVar9 = pwVar1;
          }
          memcpy(pwVar9,cA,(ulong)uVar6 << 3);
        }
        lVar10 = lVar10 + -1;
      } while (-lVar7 != lVar10);
    }
  }
  else {
    iVar5 = strcmp(wt->ext,"sym");
    if (iVar5 != 0) {
      printf("Signal extension can be either per or sym");
      exit(-1);
    }
    if (0 < iVar2) {
      iVar5 = wt->outlength;
      uVar8 = local_38;
      lVar10 = lVar7;
      do {
        dVar12 = ceil((double)((int)uVar8 + iVar11 + -2) * 0.5);
        uVar6 = (uint)dVar12;
        uVar8 = (ulong)uVar6;
        wt->length[lVar10] = uVar6;
        iVar5 = iVar5 + uVar6;
        bVar4 = 1 < lVar10;
        lVar10 = lVar10 + -1;
      } while (bVar4);
      wt->outlength = iVar5;
    }
    iVar11 = wt->length[1];
    wt->length[0] = iVar11;
    iVar11 = iVar11 + wt->outlength;
    wt->outlength = iVar11;
    if (0 < iVar2) {
      pwVar1 = wt + 1;
      lVar10 = 0;
      do {
        uVar6 = wt->length[lVar7 + lVar10];
        iVar11 = iVar11 - uVar6;
        iVar5 = strcmp(wt->cmethod,"fft");
        if ((iVar5 == 0) || (iVar5 = strcmp(wt->cmethod,"FFT"), iVar5 == 0)) {
          dwt1(wt,(double *)sig,(int)local_38,cA,
               (double *)(pwVar1->method + (long)iVar11 * 8 + -0x10));
        }
        else {
          pwVar3 = wt->wave;
          dwt_sym_stride((double *)sig,(int)local_38,pwVar3->lpd,pwVar3->hpd,pwVar3->lpd_len,cA,
                         uVar6,(double *)(pwVar1->method + (long)iVar11 * 8 + -0x10),1,1);
        }
        local_38 = (ulong)(uint)wt->length[lVar7 + lVar10];
        if (0 < (int)uVar6) {
          pwVar9 = sig;
          if (-(ulong)(iVar2 - 1) == lVar10) {
            pwVar9 = pwVar1;
          }
          memcpy(pwVar9,cA,(ulong)uVar6 << 3);
        }
        lVar10 = lVar10 + -1;
      } while (-lVar7 != lVar10);
    }
  }
  free(sig);
  free(cA);
  return;
}

Assistant:

void dwt(wt_object wt,const double *inp) {
	int i,J,temp_len,iter,N,lp;
	int len_cA;
	double *orig,*orig2;

	temp_len = wt->siglength;
	J = wt->J;
	wt->length[J + 1] = temp_len;
	wt->outlength = 0;
	wt->zpad = 0;
	orig = (double*)malloc(sizeof(double)* temp_len);
	orig2 = (double*)malloc(sizeof(double)* temp_len);
	/*
	if ((temp_len % 2) == 0) {
	wt->zpad = 0;
	orig = (double*)malloc(sizeof(double)* temp_len);
	orig2 = (double*)malloc(sizeof(double)* temp_len);
	}
	else {
	wt->zpad = 1;
	temp_len++;
	orig = (double*)malloc(sizeof(double)* temp_len);
	orig2 = (double*)malloc(sizeof(double)* temp_len);
	}
	*/

	for (i = 0; i < wt->siglength; ++i) {
		orig[i] = inp[i];
	}

	if (wt->zpad == 1) {
		orig[temp_len - 1] = orig[temp_len - 2];
	}

	N = temp_len;
	lp = wt->wave->lpd_len;

	if (!strcmp(wt->ext,"per")) {
		i = J;
		while (i > 0) {
			N = (int)ceil((double)N / 2.0);
			wt->length[i] = N;
			wt->outlength += wt->length[i];
			i--;
		}
		wt->length[0] = wt->length[1];
		wt->outlength += wt->length[0];
		N = wt->outlength;

		for (iter = 0; iter < J; ++iter) {
			len_cA = wt->length[J - iter];
			N -= len_cA;
			if ( !strcmp(wt->cmethod, "fft") || !strcmp(wt->cmethod, "FFT") ) {
				dwt1(wt, orig, temp_len, orig2, wt->params + N);
			}
			else {
				dwt_per(wt, orig, temp_len, orig2, len_cA, wt->params + N);
			}
			temp_len = wt->length[J - iter];
			if (iter == J - 1) {
				for (i = 0; i < len_cA; ++i) {
					wt->params[i] = orig2[i];
				}
			}
			else {
				for (i = 0; i < len_cA; ++i) {
					orig[i] = orig2[i];
				}
			}
		}
	}
	else if (!strcmp(wt->ext,"sym")) {
		//printf("\n YES %s \n", wt->ext);
		i = J;
		while (i > 0) {
			N = N + lp - 2;
			N = (int) ceil((double)N / 2.0);
			wt->length[i] = N;
			wt->outlength += wt->length[i];
			i--;
		}
		wt->length[0] = wt->length[1];
		wt->outlength += wt->length[0];
		N = wt->outlength;

		for (iter = 0; iter < J; ++iter) {
			len_cA = wt->length[J - iter];
			N -= len_cA;
			if (!strcmp(wt->cmethod, "fft") || !strcmp(wt->cmethod, "FFT")) {
				dwt1(wt, orig, temp_len, orig2, wt->params + N);
			}
			else {
				dwt_sym(wt, orig, temp_len, orig2, len_cA, wt->params + N);
			}
			temp_len = wt->length[J - iter];

			if (iter == J - 1) {
				for (i = 0; i < len_cA; ++i) {
					wt->params[i] = orig2[i];
				}
			}
			else {
				for (i = 0; i < len_cA; ++i) {
					orig[i] = orig2[i];
				}
			}
		}
	}
	else {
		printf("Signal extension can be either per or sym");
		exit(-1);
	}

	free(orig);
	free(orig2);
}